

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TN93.cpp
# Opt level: O0

void dump_histogram(ostream *outStream,char *tag,unsigned_long *hist)

{
  ostream *poVar1;
  long in_RDX;
  char *in_RSI;
  ostream *in_RDI;
  undefined1 auVar2 [16];
  unsigned_long k;
  ulong local_20;
  
  if (in_RSI == (char *)0x0) {
    std::operator<<(in_RDI,"\t\"Histogram\" : [");
  }
  else {
    poVar1 = std::operator<<(in_RDI,"\t\"Histogram ");
    poVar1 = std::operator<<(poVar1,in_RSI);
    std::operator<<(poVar1,"\" : [");
  }
  for (local_20 = 0; local_20 < 200; local_20 = local_20 + 1) {
    if (local_20 != 0) {
      std::operator<<(in_RDI,',');
    }
    poVar1 = std::operator<<(in_RDI,'[');
    auVar2._8_4_ = (int)(local_20 >> 0x20);
    auVar2._0_8_ = local_20;
    auVar2._12_4_ = 0x45300000;
    poVar1 = (ostream *)
             std::ostream::operator<<
                       (poVar1,((auVar2._8_8_ - 1.9342813113834067e+25) +
                                ((double)CONCAT44(0x43300000,(int)local_20) - 4503599627370496.0) +
                               1.0) / 200.0);
    poVar1 = std::operator<<(poVar1,',');
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(ulong *)(in_RDX + local_20 * 8));
    std::operator<<(poVar1,']');
  }
  poVar1 = std::operator<<(in_RDI,"]");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void dump_histogram(ostream *outStream, const char *tag, unsigned long *hist) {
  if (tag) {
    (*outStream) << "\t\"Histogram " << tag << "\" : [";
  } else {
    (*outStream) << "\t\"Histogram\" : [";
  }
  for (unsigned long k = 0; k < HISTOGRAM_BINS; k++) {
    if (k) {
      (*outStream) << ',';
    }
    (*outStream) << '[' << (k + 1.) / HISTOGRAM_BINS << ',' << hist[k] << ']';
  }
  (*outStream) << "]" << endl;
}